

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O2

float closest_point_ray_circle(vec3 ro,vec3 rd,vec3 cc,vec3 cn,float cr,float *s,vec3 *c1,vec3 *c2)

{
  undefined4 uVar1;
  undefined4 uVar2;
  _Bool _Var3;
  float fVar4;
  float fVar5;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar6;
  float fVar7;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  vec3 vVar8;
  float t;
  int idx;
  vec3 local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  vec3 local_38;
  vec3 local_28;
  
  local_38.z = cn.z;
  local_38._0_8_ = cn._0_8_;
  fVar7 = cc.z;
  local_68._0_8_ = cc._0_8_;
  local_48._8_4_ = in_XMM0_Dc;
  local_48._0_8_ = ro._0_8_;
  local_48._12_4_ = in_XMM0_Dd;
  local_58._8_4_ = in_XMM2_Dc;
  local_58._0_8_ = rd._0_8_;
  local_58._12_4_ = in_XMM2_Dd;
  local_28._0_8_ = local_68._0_8_;
  local_28.z = fVar7;
  _Var3 = ray_intersect_planes(ro,rd,&local_28,&local_38,1,&t,&idx);
  if (_Var3) {
    *s = t;
    fVar4 = t * (float)local_58._0_4_ + (float)local_48._0_4_;
    fVar5 = t * (float)local_58._4_4_ + (float)local_48._4_4_;
    fVar6 = rd.z * t + ro.z;
    c1->x = fVar4;
    c1->y = fVar5;
    c1->z = fVar6;
    vVar8.x = fVar4 - local_68.x;
    vVar8.y = fVar5 - local_68.y;
    vVar8.z = fVar6 - fVar7;
    vVar8 = vec3_set_length(vVar8,cr);
    local_68.x = vVar8.x + local_68.x;
    local_68.y = vVar8.y + local_68.y;
    fVar7 = vVar8.z + fVar7;
    c2->x = local_68.x;
    c2->y = local_68.y;
    c2->z = fVar7;
    uVar1 = c1->x;
    uVar2 = c1->y;
    local_68.x = (float)uVar1 - local_68.x;
    local_68.y = (float)uVar2 - local_68.y;
    fVar7 = c1->z - fVar7;
    fVar7 = SQRT(fVar7 * fVar7 + local_68.x * local_68.x + local_68.y * local_68.y);
  }
  else {
    *s = 3.4028235e+38;
    c1->x = 3.4028235e+38;
    c1->y = 3.4028235e+38;
    c1->z = 3.4028235e+38;
    c2->x = 3.4028235e+38;
    c2->y = 3.4028235e+38;
    c2->z = 3.4028235e+38;
    fVar7 = 3.4028235e+38;
  }
  return fVar7;
}

Assistant:

float closest_point_ray_circle(vec3 ro, vec3 rd, vec3 cc, vec3 cn, float cr, float *s, vec3 *c1, vec3 *c2) {
    float t;
    int idx;
    if (ray_intersect_planes(ro, rd, &cc, &cn, 1, &t, &idx)) {
        *s = t;
        *c1 = vec3_add(ro, vec3_scale(rd, t));    
        *c2 = vec3_add(cc, vec3_set_length(vec3_subtract(*c1, cc), cr));
        return vec3_distance(*c1, *c2);
    } else {
        // This is wrong, but probably doesn't matter...
        *s = FLT_MAX;
        *c1 = V3(FLT_MAX, FLT_MAX, FLT_MAX);
        *c2 = V3(FLT_MAX, FLT_MAX, FLT_MAX);
        return FLT_MAX;
    }
}